

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O3

void __thiscall
ExprVisitorTest_VisitStringLiteral_Test::TestBody(ExprVisitorTest_VisitStringLiteral_Test *this)

{
  StrictMock<MockVisitor> *this_00;
  bool bVar1;
  StringLiteral value;
  MockSpec<TestResult_(mp::StringLiteral)> *this_01;
  logic_error *this_02;
  char *message;
  FunctionMocker<TestResult_(mp::StringLiteral)> *this_03;
  StringRef value_00;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  AssertionResult local_30;
  
  value_00.size_ = 3;
  value_00.data_ = "foo";
  value = mp::BasicExprFactory<std::allocator<char>_>::MakeStringLiteral
                    (&(this->super_ExprVisitorTest).factory_,value_00);
  this_00 = &(this->super_ExprVisitorTest).visitor_;
  testing::Matcher<mp::StringLiteral>::Matcher((Matcher<mp::StringLiteral> *)local_50,value);
  this_03 = &(this->super_ExprVisitorTest).visitor_.super_MockVisitor.gmock1_VisitStringLiteral_162;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_03,this_00);
  this_01 = testing::internal::FunctionMocker<TestResult_(mp::StringLiteral)>::With
                      (this_03,(Matcher<mp::StringLiteral> *)local_50);
  testing::internal::MockSpec<TestResult_(mp::StringLiteral)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x21a,"visitor_","VisitStringLiteral(e)");
  local_50._0_8_ = &PTR__MatcherBase_001e2ad0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::StringLiteral>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::StringLiteral>_> *)(local_50 + 8));
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)this_00,
             (Expr)value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.
                   impl_);
  testing::AssertionSuccess();
  if (local_30.success_ == true) {
    if (0x47 < *(uint *)value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase
                        .impl_) {
      this_02 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_02,"invalid expression kind");
      *(undefined ***)this_02 = &PTR__logic_error_001e2c88;
      __cxa_throw(this_02,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
    }
    fmt::format<char_const*>
              ((string *)local_50,(fmt *)"unsupported: {}",(CStringRef)&stack0xffffffffffffffa8,
               (char **)mp::internal::ExprInfo::INFO);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::Mock::FailUninterestingCalls(&stack0xffffffffffffffa8);
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 &stack0xffffffffffffffa8,
                 (Expr)value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.
                       impl_);
      testing::Mock::UnregisterCallReaction(&PTR__StrictMock_001e44f8);
    }
    testing::AssertionResult::operator<<
              (&local_30,
               (char (*) [127])
               "Expected: StrictMock<NullVisitor>().Visit(base) throws an exception of type mp::UnsupportedError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,(ulong)(local_40._M_allocated_capacity + 1));
    }
  }
  testing::Message::Message((Message *)local_50);
  if (local_30.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_30.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x21d,message);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffffa8,(Message *)local_50);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_50._0_8_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitStringLiteral) {
  auto e = factory_.MakeStringLiteral("foo");
  EXPECT_CALL(visitor_, VisitStringLiteral(e));
  mp::Expr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED(base);
}